

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.cpp
# Opt level: O1

int main(void)

{
  size_type __n;
  deflate_encoder enc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> text;
  ifstream in;
  allocator_type local_242;
  deflate_encoder local_241;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_240;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_228;
  char local_210 [520];
  
  std::ifstream::ifstream(local_210,"C:\\Users\\Andy\\gilgamesh\\examples\\data\\4GRG.pdb",_S_bin);
  std::istream::seekg((long)local_210,_S_beg);
  __n = std::istream::tellg();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_228,__n,(allocator_type *)&local_240);
  std::istream::seekg((long)local_210,_S_beg);
  std::istream::read(local_210,
                     (long)local_228.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_240,__n,&local_242);
  andyzip::deflate_encoder::encode
            (&local_241,
             local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + __n,
             local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + (__n - 1));
  if (local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_240.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_240.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::ifstream::~ifstream(local_210);
  return 0;
}

Assistant:

int main() {
  andyzip::deflate_encoder enc;

  //static const uint8_t text[] = "to be or not to be, that is the question! 1234 1234 1234";
  //static const uint8_t text[] = "123123123";

  std::ifstream in("C:\\Users\\Andy\\gilgamesh\\examples\\data\\4GRG.pdb", std::ios::binary);
  in.seekg(0, std::ios::end);
  size_t size = (size_t)in.tellg();
  std::vector<uint8_t> text(size);
  in.seekg(0, std::ios::beg);
  in.read((char*)text.data(), size);
  std::vector<uint8_t> buffer(size);
  enc.encode(buffer.data(), buffer.data() + size, text.data(), text.data() + size - 1);
}